

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

bool __thiscall
ContextSpecificHolder<Integer,_(unsigned_char)'\xa0',_(OptionType)1>::Decode
          (ContextSpecificHolder<Integer,_(unsigned_char)__xa0_,_(OptionType)1> *this,uchar *pIn,
          size_t cbIn,size_t *cbUsed)

{
  bool bVar1;
  out_of_range *this_00;
  size_t local_58;
  size_t cbPrefix;
  size_t size;
  size_t offset;
  size_t *local_30;
  size_t *cbUsed_local;
  size_t cbIn_local;
  uchar *pIn_local;
  ContextSpecificHolder<Integer,_(unsigned_char)__xa0_,_(OptionType)1> *this_local;
  
  local_30 = cbUsed;
  cbUsed_local = (size_t *)cbIn;
  cbIn_local = (size_t)pIn;
  pIn_local = (uchar *)this;
  if (cbIn == 0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"Insufficient buffer");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  if (*pIn == 0xa0) {
    size = 0;
    cbPrefix = 0;
    local_58 = 0;
    bVar1 = CheckDecode(pIn,cbIn,(uint)*pIn,&cbPrefix,&local_58);
    if (!bVar1) {
      *local_30 = 0;
      return false;
    }
    size = local_58 + size;
    bVar1 = Integer::Decode(&this->innerType,(uchar *)(cbIn_local + size),cbPrefix,local_30);
    if (bVar1) {
      *local_30 = local_58 + *local_30;
      this->hasData = true;
      return true;
    }
  }
  *local_30 = 0;
  return false;
}

Assistant:

bool Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
	{
        // If this is an optional type, we could have used
        // all the bytes on the previous item
        if (cbIn == 0)
            throw std::out_of_range("Insufficient buffer");

        if (pIn[0] == type)
        {
            size_t offset = 0;

            // Validate the sequence
            size_t size = 0;
            size_t cbPrefix = 0;

            if (!CheckDecode(pIn, cbIn, static_cast<const DerType>(*pIn), size, cbPrefix))
            {
                cbUsed = 0;
                return false;
            }

            offset += cbPrefix;
            // Now, we can decode the inner type
            if (innerType.Decode(pIn + offset, size, cbUsed))
            {
                cbUsed += cbPrefix;
                hasData = true;
                return true;
            }
        }

        cbUsed = 0;
        return false;
	}